

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O3

StatementBlockSymbol *
slang::ast::StatementBlockSymbol::fromSyntax(Scope *scope,RandSequenceStatementSyntax *syntax)

{
  NamedLabelSyntax *pNVar1;
  size_type sVar2;
  Compilation *compilation;
  pointer ppPVar3;
  ProductionSyntax *syntax_00;
  SourceLocation SVar4;
  StatementBlockSymbol *pSVar5;
  RandSeqProductionSymbol *symbol;
  Scope *this;
  long lVar6;
  string_view sVar7;
  string_view name;
  Token token;
  _Optional_payload_base<slang::ast::VariableLifetime> in_stack_ffffffffffffffb0;
  Token local_48;
  
  SVar4 = parsing::Token::location(&syntax->randsequence);
  pNVar1 = (syntax->super_StatementSyntax).label;
  if (pNVar1 == (NamedLabelSyntax *)0x0) {
    sVar7 = (string_view)(ZEXT816(0x3f0621) << 0x40);
  }
  else {
    local_48.kind = (pNVar1->name).kind;
    local_48._2_1_ = (pNVar1->name).field_0x2;
    local_48.numFlags.raw = (pNVar1->name).numFlags.raw;
    local_48.rawLen = (pNVar1->name).rawLen;
    local_48.info = (pNVar1->name).info;
    sVar7 = parsing::Token::valueText(&local_48);
    SVar4 = parsing::Token::location(&local_48);
  }
  name._M_str = (char *)SVar4;
  name._M_len = (size_t)sVar7._M_str;
  pSVar5 = createBlock((ast *)scope,(Scope *)syntax,(StatementSyntax *)sVar7._M_len,name,
                       (SourceLocation)0x0,Sequential,
                       (optional<slang::ast::VariableLifetime>)in_stack_ffffffffffffffb0);
  sVar2 = (syntax->productions).
          super_span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>.size_;
  if (sVar2 != 0) {
    compilation = scope->compilation;
    ppPVar3 = (syntax->productions).
              super_span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>.data_;
    this = &pSVar5->super_Scope;
    lVar6 = 0;
    do {
      syntax_00 = *(ProductionSyntax **)((long)ppPVar3 + lVar6);
      sVar7 = parsing::Token::valueText(&syntax_00->name);
      if (sVar7._M_len != 0) {
        symbol = RandSeqProductionSymbol::fromSyntax(compilation,syntax_00);
        Scope::addMember(this,&symbol->super_Symbol);
      }
      lVar6 = lVar6 + 8;
    } while (sVar2 << 3 != lVar6);
  }
  return pSVar5;
}

Assistant:

StatementBlockSymbol& StatementBlockSymbol::fromSyntax(const Scope& scope,
                                                       const RandSequenceStatementSyntax& syntax) {
    auto [name, loc] = getLabel(syntax, syntax.randsequence.location());
    auto result = createBlock(scope, syntax, name, loc, StatementBlockKind::Sequential,
                              VariableLifetime::Automatic);

    auto& comp = scope.getCompilation();
    for (auto prod : syntax.productions) {
        if (prod->name.valueText().empty())
            continue;

        auto& symbol = RandSeqProductionSymbol::fromSyntax(comp, *prod);
        result->addMember(symbol);
    }

    return *result;
}